

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dorpi.cpp
# Opt level: O1

void __thiscall numerary::TestDorpi::test_dorpi::test_method(test_dorpi *this)

{
  double *y;
  double in_XMM1_Qa;
  short result;
  short expected_result;
  undefined1 local_118 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  short *local_f8;
  assertion_result local_f0;
  short **local_d8;
  short *local_d0;
  assertion_result local_c8;
  undefined1 local_b0 [16];
  undefined1 *local_a0;
  char *local_98;
  const_string local_90;
  const_string local_80;
  const_string local_70;
  const_string local_60;
  const_string local_50;
  const_string local_40;
  
  y = (double *)operator_new__(0x10);
  *y = 3.0;
  expected_result = 0;
  local_118._0_8_ = &local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"dorpi_4_5","");
  result = Numerary::ordinary_differential_equations
                     (test_dorpi_function_1,y,1.0,in_XMM1_Qa,2.0,(string *)local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._0_8_ != &local_108) {
    operator_delete((void *)local_118._0_8_,(ulong)(local_108._M_allocated_capacity + 1));
  }
  local_50.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/tivole[P]Numerary/test/test_dorpi.cpp";
  local_50.m_end = "";
  local_60.m_begin = "";
  local_60.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_50,0x20,&local_60);
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0._0_8_ = &PTR__lazy_ostream_001c0c30;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_d0 = &result;
  local_f8 = &expected_result;
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(result == expected_result);
  local_98 = "";
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_40.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/tivole[P]Numerary/test/test_dorpi.cpp";
  local_40.m_end = "";
  local_108._8_8_ = &local_d0;
  local_118[8] = false;
  local_118._0_8_ = &PTR__lazy_ostream_001c0c70;
  local_108._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_f8;
  local_f0.m_message.px = (element_type *)((ulong)local_f0.m_message.px & 0xffffffffffffff00);
  local_f0._0_8_ = &PTR__lazy_ostream_001c0c70;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,(lazy_ostream *)local_b0,&local_40,0x20,CHECK,CHECK_EQUAL,2,"result",
             local_118,"expected_result",&local_f0);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  local_70.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/tivole[P]Numerary/test/test_dorpi.cpp";
  local_70.m_end = "";
  local_80.m_begin = "";
  local_80.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x22,&local_80);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(ABS(36.0 - y[1]) < 0.0001);
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0._0_8_ = "fabs(expected_answer - y[1]) < 1.e-4";
  local_b0._8_8_ = "";
  local_118[8] = false;
  local_118._0_8_ = &PTR__lazy_ostream_001c0cb0;
  local_108._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_90.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/tivole[P]Numerary/test/test_dorpi.cpp";
  local_90.m_end = "";
  local_108._8_8_ = (lazy_ostream *)local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,(lazy_ostream *)local_118,&local_90,0x22,CHECK,CHECK_PRED,0);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  operator_delete__(y);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_dorpi)
    {
        double *y = new double[2];
        double x0, x, h, expected_answer;
        short int expected_result, result;

        // Initial points
        x0 = 1; y[0] = 3;

        x = 2.0;

        expected_result = 0;
        expected_answer = 36;
        result = Numerary::ordinary_differential_equations(test_dorpi_function_1, y, x0, h, x, "dorpi_4_5");
        BOOST_CHECK_EQUAL(result, expected_result);

        BOOST_CHECK(fabs(expected_answer - y[1]) < 1.e-4);

        delete[] y;
    }